

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPTi.cpp
# Opt level: O2

void __thiscall OpenMD::NPTi::scaleSimBox(NPTi *this)

{
  double s;
  Mat3x3d hmat;
  RectMatrix<double,_3U,_3U> local_58;
  
  s = exp((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.dt * this->eta);
  if ((s <= 1.1) && (0.9 <= s)) {
    Snapshot::getHmat((Mat3x3d *)&local_58,
                      (this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.snap);
    RectMatrix<double,_3U,_3U>::mul(&local_58,s);
    Snapshot::setHmat((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.snap,
                      (Mat3x3d *)&local_58);
    return;
  }
  snprintf(painCave.errMsg,2000,
           "NPTi error: Attempting a Box scaling of more than 10 percent check your tauBarostat, as it is probably too small!\n eta = %lf, scaleFactor = %lf\n"
           ,this->eta);
  painCave.isFatal = 1;
  simError();
  return;
}

Assistant:

void NPTi::scaleSimBox() {
    RealType scaleFactor;

    scaleFactor = exp(dt * eta);

    if ((scaleFactor > 1.1) || (scaleFactor < 0.9)) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "NPTi error: Attempting a Box scaling of more than 10 percent"
               " check your tauBarostat, as it is probably too small!\n"
               " eta = %lf, scaleFactor = %lf\n",
               eta, scaleFactor);
      painCave.isFatal = 1;
      simError();
    } else {
      Mat3x3d hmat = snap->getHmat();
      hmat *= scaleFactor;
      snap->setHmat(hmat);
    }
  }